

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

void IoTHubTransport_MQTT_Common_Unsubscribe_DeviceMethod(TRANSPORT_LL_HANDLE handle)

{
  MQTT_CLIENT_HANDLE handle_00;
  uint16_t packetId;
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  char *unsubscribe [1];
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  TRANSPORT_LL_HANDLE handle_local;
  
  unsubscribe[0] = (char *)handle;
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Unsubscribe_DeviceMethod",0xda2,1,
                "Invalid argument to unsubscribe (NULL).");
    }
  }
  else if (*(long *)((long)handle + 0x28) != 0) {
    l = (LOGGER_LOG)STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x28));
    handle_00 = *(MQTT_CLIENT_HANDLE *)(unsubscribe[0] + 0x70);
    packetId = getNextPacketId((PMQTTTRANSPORT_HANDLE_DATA)unsubscribe[0]);
    iVar1 = mqtt_client_unsubscribe(handle_00,packetId,(char **)&l,1);
    if ((iVar1 != 0) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Unsubscribe_DeviceMethod",0xd98,1,
                "Failure calling mqtt_client_unsubscribe");
    }
    STRING_delete(*(STRING_HANDLE *)(unsubscribe[0] + 0x28));
    unsubscribe[0][0x28] = '\0';
    unsubscribe[0][0x29] = '\0';
    unsubscribe[0][0x2a] = '\0';
    unsubscribe[0][0x2b] = '\0';
    unsubscribe[0][0x2c] = '\0';
    unsubscribe[0][0x2d] = '\0';
    unsubscribe[0][0x2e] = '\0';
    unsubscribe[0][0x2f] = '\0';
    *(uint *)(unsubscribe[0] + 0x30) = *(uint *)(unsubscribe[0] + 0x30) & 0xfffffff7;
  }
  return;
}

Assistant:

void IoTHubTransport_MQTT_Common_Unsubscribe_DeviceMethod(TRANSPORT_LL_HANDLE handle)
{
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data != NULL)
    {
        if (transport_data->topic_DeviceMethods != NULL)
        {
            const char* unsubscribe[1];
            unsubscribe[0] = STRING_c_str(transport_data->topic_DeviceMethods);

            if (mqtt_client_unsubscribe(transport_data->mqttClient, getNextPacketId(transport_data), unsubscribe, 1) != 0)
            {
                LogError("Failure calling mqtt_client_unsubscribe");
            }

            STRING_delete(transport_data->topic_DeviceMethods);
            transport_data->topic_DeviceMethods = NULL;
            transport_data->topics_ToSubscribe &= ~SUBSCRIBE_DEVICE_METHOD_TOPIC;
        }
    }
    else
    {
        LogError("Invalid argument to unsubscribe (NULL).");
    }
}